

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O3

QByteArray * __thiscall
QByteArray::right(QByteArray *__return_storage_ptr__,QByteArray *this,qsizetype n)

{
  long lVar1;
  Data *pDVar2;
  long lVar3;
  
  lVar1 = (this->d).size;
  if (n < lVar1) {
    lVar3 = 0;
    if (0 < n) {
      lVar3 = n;
    }
    QByteArray::QByteArray(__return_storage_ptr__,(this->d).ptr + (lVar1 - lVar3),lVar3);
  }
  else {
    pDVar2 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = lVar1;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] QByteArray right(qsizetype n) const &
    {
        if (n >= size())
            return *this;
        return last(qMax(n, 0));
    }